

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O2

_Bool stream_flags_decode(lzma_stream_flags *options,uint8_t *in)

{
  if ((*in == '\0') && (in[1] < 0x10)) {
    options->version = 0;
    options->check = in[1] & 0xf;
    return false;
  }
  return true;
}

Assistant:

static bool
stream_flags_decode(lzma_stream_flags *options, const uint8_t *in)
{
	// Reserved bits must be unset.
	if (in[0] != 0x00 || (in[1] & 0xF0))
		return true;

	options->version = 0;
	options->check = in[1] & 0x0F;

	return false;
}